

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

bool __thiscall ON_SubDComponentFilter::AcceptEdge(ON_SubDComponentFilter *this,ON_SubDEdge *e)

{
  Topology TVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  
  if ((e != (ON_SubDEdge *)0x0) && (this->m_bRejectEdges == false)) {
    if (this->m_edge_tag_filter[0] == Unset) {
LAB_005efd1b:
      TVar1 = this->m_edge_topology_filter;
      if (TVar1 != Unset) {
        if (e->m_face_count == 2) {
          TVar1 = TVar1 & Interior;
        }
        else if (e->m_face_count == 1) {
          TVar1 = TVar1 & Boundary;
        }
        else {
          TVar1 = TVar1 & Nonmanifold;
        }
        if (TVar1 == Unset) {
          return false;
        }
      }
      return true;
    }
    lVar4 = 0;
    bVar2 = true;
    do {
      bVar3 = bVar2;
      if (this->m_edge_tag_filter[lVar4] == Unset) {
        return false;
      }
      if (this->m_edge_tag_filter[lVar4] == e->m_edge_tag) goto LAB_005efd1b;
      lVar4 = 1;
      bVar2 = false;
    } while (bVar3);
  }
  return false;
}

Assistant:

bool ON_SubDComponentFilter::AcceptEdge(const ON_SubDEdge * e) const
{
  if (m_bRejectEdges)
    return false;

  if (nullptr == e)
    return false;

  if (false == AcceptEdgeTag(e->m_edge_tag))
    return false;

  if (ON_SubDComponentFilter::Topology::Unset != m_edge_topology_filter)
  {
    // check boundary/interior/nonmanifold
    if (1 == e->m_face_count)
    {
      if (0 == (static_cast<unsigned char>(ON_SubDComponentFilter::Topology::Boundary)& static_cast<unsigned char>(m_edge_topology_filter)))
        return false;
    }
    else if (2 == e->m_face_count)
    {
      if (0 == (static_cast<unsigned char>(ON_SubDComponentFilter::Topology::Interior)& static_cast<unsigned char>(m_edge_topology_filter)))
        return false;
    }
    else
    {
      if (0 == (static_cast<unsigned char>(ON_SubDComponentFilter::Topology::Nonmanifold)& static_cast<unsigned char>(m_edge_topology_filter)))
        return false;
    }
  }

  return true;
}